

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apinames.cpp
# Opt level: O0

int test_c(void)

{
  bool bVar1;
  value_type vVar2;
  int iVar3;
  RtMidiApi *pRVar4;
  reference pvVar5;
  char *pcVar6;
  ulong uVar7;
  ostream *poVar8;
  undefined8 uVar9;
  undefined1 *puVar10;
  undefined1 local_28c;
  char *local_230;
  char *local_1f8;
  char *local_1c8;
  RtMidiApi api_1;
  RtMidiApi api;
  size_t j;
  string local_120 [8];
  string name_2;
  char *s_1;
  size_t i_1;
  undefined1 local_e8 [8];
  string displayName_1;
  string local_c0 [8];
  string name_1;
  char *s;
  string local_90 [8];
  string displayName;
  string local_68 [8];
  string name;
  size_t i;
  allocator<RtMidiApi> local_29;
  undefined1 local_28 [8];
  vector<RtMidiApi,_std::allocator<RtMidiApi>_> apis;
  uint api_count;
  
  apis.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = rtmidi_get_compiled_api(0);
  uVar7 = (ulong)apis.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
  std::allocator<RtMidiApi>::allocator(&local_29);
  std::vector<RtMidiApi,_std::allocator<RtMidiApi>_>::vector
            ((vector<RtMidiApi,_std::allocator<RtMidiApi>_> *)local_28,uVar7,&local_29);
  std::allocator<RtMidiApi>::~allocator(&local_29);
  pRVar4 = std::vector<RtMidiApi,_std::allocator<RtMidiApi>_>::data
                     ((vector<RtMidiApi,_std::allocator<RtMidiApi>_> *)local_28);
  rtmidi_get_compiled_api
            (pRVar4,apis.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_);
  std::operator<<((ostream *)&std::cout,"API names by identifier (C):\n");
  for (name.field_2._8_8_ = 0;
      (ulong)name.field_2._8_8_ <
      (ulong)apis.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
      name.field_2._8_8_ = name.field_2._8_8_ + 1) {
    pvVar5 = std::vector<RtMidiApi,_std::allocator<RtMidiApi>_>::operator[]
                       ((vector<RtMidiApi,_std::allocator<RtMidiApi>_> *)local_28,name.field_2._8_8_
                       );
    pcVar6 = (char *)rtmidi_api_name(*pvVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_68,pcVar6,(allocator<char> *)(displayName.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(displayName.field_2._M_local_buf + 0xf));
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) != 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Invalid name for API ");
      pvVar5 = std::vector<RtMidiApi,_std::allocator<RtMidiApi>_>::operator[]
                         ((vector<RtMidiApi,_std::allocator<RtMidiApi>_> *)local_28,
                          name.field_2._8_8_);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar5);
      std::operator<<(poVar8,"\n");
      exit(1);
    }
    pvVar5 = std::vector<RtMidiApi,_std::allocator<RtMidiApi>_>::operator[]
                       ((vector<RtMidiApi,_std::allocator<RtMidiApi>_> *)local_28,name.field_2._8_8_
                       );
    pcVar6 = (char *)rtmidi_api_display_name(*pvVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_90,pcVar6,(allocator<char> *)((long)&s + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) != 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Invalid display name for API ");
      pvVar5 = std::vector<RtMidiApi,_std::allocator<RtMidiApi>_>::operator[]
                         ((vector<RtMidiApi,_std::allocator<RtMidiApi>_> *)local_28,
                          name.field_2._8_8_);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar5);
      std::operator<<(poVar8,"\n");
      exit(1);
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"* ");
    pvVar5 = std::vector<RtMidiApi,_std::allocator<RtMidiApi>_>::operator[]
                       ((vector<RtMidiApi,_std::allocator<RtMidiApi>_> *)local_28,name.field_2._8_8_
                       );
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar5);
    poVar8 = std::operator<<(poVar8," \'");
    poVar8 = std::operator<<(poVar8,local_68);
    poVar8 = std::operator<<(poVar8,"\': \'");
    poVar8 = std::operator<<(poVar8,local_90);
    std::operator<<(poVar8,"\'\n");
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_68);
  }
  name_1.field_2._8_8_ = rtmidi_api_name(0xffffffff);
  local_1c8 = (char *)name_1.field_2._8_8_;
  if ((char *)name_1.field_2._8_8_ == (char *)0x0) {
    local_1c8 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,local_1c8,(allocator<char> *)(displayName_1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(displayName_1.field_2._M_local_buf + 0xf));
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"Bad string for invalid API \'");
    poVar8 = std::operator<<(poVar8,local_c0);
    std::operator<<(poVar8,"\'\n");
    exit(1);
  }
  name_1.field_2._8_8_ = rtmidi_api_display_name(0xffffffff);
  local_1f8 = (char *)name_1.field_2._8_8_;
  if ((char *)name_1.field_2._8_8_ == (char *)0x0) {
    local_1f8 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,local_1f8,(allocator<char> *)((long)&i_1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_e8,"Unknown");
  if (bVar1) {
    poVar8 = std::operator<<((ostream *)&std::cout,"Bad display string for invalid API \'");
    poVar8 = std::operator<<(poVar8,(string *)local_e8);
    std::operator<<(poVar8,"\'\n");
    exit(1);
  }
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string(local_c0);
  std::operator<<((ostream *)&std::cout,"API identifiers by name (C):\n");
  s_1 = (char *)0x0;
  while( true ) {
    if ((char *)(ulong)apis.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_ <= s_1) {
      iVar3 = rtmidi_compiled_api_by_name("");
      if (iVar3 == 0) {
        std::vector<RtMidiApi,_std::allocator<RtMidiApi>_>::~vector
                  ((vector<RtMidiApi,_std::allocator<RtMidiApi>_> *)local_28);
        return 0;
      }
      std::operator<<((ostream *)&std::cout,"Bad identifier for unknown API name\n");
      exit(1);
    }
    pvVar5 = std::vector<RtMidiApi,_std::allocator<RtMidiApi>_>::operator[]
                       ((vector<RtMidiApi,_std::allocator<RtMidiApi>_> *)local_28,(size_type)s_1);
    name_2.field_2._8_8_ = rtmidi_api_name(*pvVar5);
    local_230 = (char *)name_2.field_2._8_8_;
    if ((char *)name_2.field_2._8_8_ == (char *)0x0) {
      local_230 = "";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_120,local_230,(allocator<char> *)((long)&j + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&j + 7));
    uVar9 = std::__cxx11::string::c_str();
    vVar2 = rtmidi_compiled_api_by_name(uVar9);
    pvVar5 = std::vector<RtMidiApi,_std::allocator<RtMidiApi>_>::operator[]
                       ((vector<RtMidiApi,_std::allocator<RtMidiApi>_> *)local_28,(size_type)s_1);
    if (vVar2 != *pvVar5) break;
    poVar8 = std::operator<<((ostream *)&std::cout,"* \'");
    poVar8 = std::operator<<(poVar8,local_120);
    poVar8 = std::operator<<(poVar8,"\': ");
    pvVar5 = std::vector<RtMidiApi,_std::allocator<RtMidiApi>_>::operator[]
                       ((vector<RtMidiApi,_std::allocator<RtMidiApi>_> *)local_28,(size_type)s_1);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar5);
    std::operator<<(poVar8,"\n");
    for (_api_1 = 0; uVar7 = std::__cxx11::string::size(), _api_1 < uVar7; _api_1 = _api_1 + 1) {
      if ((_api_1 & 1) == 0) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_120);
        iVar3 = tolower((int)*pcVar6);
        local_28c = (undefined1)iVar3;
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_120);
        iVar3 = toupper((int)*pcVar6);
        local_28c = (undefined1)iVar3;
      }
      puVar10 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_120);
      *puVar10 = local_28c;
    }
    uVar9 = std::__cxx11::string::c_str();
    iVar3 = rtmidi_compiled_api_by_name(uVar9);
    if (iVar3 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Identifier ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar3);
      poVar8 = std::operator<<(poVar8," for invalid API \'");
      poVar8 = std::operator<<(poVar8,local_120);
      std::operator<<(poVar8,"\'\n");
      exit(1);
    }
    std::__cxx11::string::~string(local_120);
    s_1 = s_1 + 1;
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"Bad identifier for API \'");
  poVar8 = std::operator<<(poVar8,local_120);
  std::operator<<(poVar8,"\'\n");
  exit(1);
}

Assistant:

int test_c() {
    unsigned api_count = rtmidi_get_compiled_api(NULL, 0);
    std::vector<RtMidiApi> apis(api_count);
    rtmidi_get_compiled_api(apis.data(), api_count);

    // ensure the known APIs return valid names
    std::cout << "API names by identifier (C):\n";
    for ( size_t i = 0; i < api_count; ++i) {
        const std::string name = rtmidi_api_name(apis[i]);
        if (name.empty()) {
            std::cout << "Invalid name for API " << (int)apis[i] << "\n";
            exit(1);
        }
        const std::string displayName = rtmidi_api_display_name(apis[i]);
        if (displayName.empty()) {
            std::cout << "Invalid display name for API " << (int)apis[i] << "\n";
            exit(1);
        }
        std::cout << "* " << (int)apis[i] << " '" << name << "': '" << displayName << "'\n";
    }

    // ensure unknown APIs return the empty string
    {
        const char *s = rtmidi_api_name((RtMidiApi)-1);
        const std::string name(s?s:"");
        if (!name.empty()) {
            std::cout << "Bad string for invalid API '" << name << "'\n";
            exit(1);
        }
        s = rtmidi_api_display_name((RtMidiApi)-1);
        const std::string displayName(s?s:"");
        if (displayName!="Unknown") {
            std::cout << "Bad display string for invalid API '" << displayName << "'\n";
            exit(1);
        }
    }

    // try getting API identifier by name
    std::cout << "API identifiers by name (C):\n";
    for ( size_t i = 0; i < api_count ; ++i ) {
        const char *s = rtmidi_api_name(apis[i]);
        std::string name(s?s:"");
        if ( rtmidi_compiled_api_by_name(name.c_str()) != apis[i] ) {
            std::cout << "Bad identifier for API '" << name << "'\n";
            exit( 1 );
        }
        std::cout << "* '" << name << "': " << (int)apis[i] << "\n";

        for ( size_t j = 0; j < name.size(); ++j )
            name[j] = (j & 1) ? toupper(name[j]) : tolower(name[j]);
        RtMidiApi api = rtmidi_compiled_api_by_name(name.c_str());
        if ( api != RTMIDI_API_UNSPECIFIED ) {
            std::cout << "Identifier " << (int)api << " for invalid API '" << name << "'\n";
            exit( 1 );
        }
    }

    // try getting an API identifier by unknown name
    {
        RtMidiApi api;
        api = rtmidi_compiled_api_by_name("");
        if ( api != RTMIDI_API_UNSPECIFIED ) {
            std::cout << "Bad identifier for unknown API name\n";
            exit( 1 );
        }
    }

    return 0;
}